

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaHeat2D_bnd.c
# Opt level: O2

int main(void)

{
  double dVar1;
  sunrealtype tres;
  int iVar2;
  int iVar3;
  N_Vector uu;
  N_Vector returnvalue;
  N_Vector returnvalue_00;
  void *pvVar4;
  void *pvVar5;
  undefined8 *returnvalue_01;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  int retval;
  void *local_80;
  N_Vector local_78;
  SUNContext ctx;
  void *local_68;
  N_Vector local_60;
  void *local_58;
  sunrealtype tret;
  long netf;
  void *local_40;
  long ncfn;
  
  retval = SUNContext_Create(0,&ctx);
  iVar3 = 1;
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    uu = (N_Vector)N_VNew_Serial(100,ctx);
    iVar2 = check_retval(uu,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      returnvalue = (N_Vector)N_VClone(uu);
      iVar2 = check_retval(returnvalue,"N_VNew_Serial",0);
      if (iVar2 == 0) {
        returnvalue_00 = (N_Vector)N_VClone(uu);
        iVar2 = check_retval(returnvalue_00,"N_VNew_Serial",0);
        if (iVar2 == 0) {
          pvVar4 = (void *)N_VClone(uu);
          iVar2 = check_retval(pvVar4,"N_VNew_Serial",0);
          if (iVar2 == 0) {
            pvVar5 = (void *)N_VClone(uu);
            iVar2 = check_retval(pvVar5,"N_VNew_Serial",0);
            if (iVar2 == 0) {
              local_80 = pvVar4;
              returnvalue_01 = (undefined8 *)malloc(0x18);
              iVar2 = check_retval(returnvalue_01,"malloc",2);
              if (iVar2 == 0) {
                *returnvalue_01 = 10;
                *(undefined4 *)(returnvalue_01 + 1) = 0x1c71c71c;
                *(undefined4 *)((long)returnvalue_01 + 0xc) = 0x3fbc71c7;
                *(undefined4 *)(returnvalue_01 + 2) = 0;
                *(undefined4 *)((long)returnvalue_01 + 0x14) = 0x40544000;
                local_60 = returnvalue_00;
                lVar6 = N_VGetArrayPointer(uu);
                local_78 = returnvalue;
                local_68 = pvVar5;
                lVar7 = N_VGetArrayPointer(returnvalue);
                lVar8 = N_VGetArrayPointer(local_68);
                N_VConst(0,local_68);
                lVar10 = lVar6;
                for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
                  dVar1 = (double)returnvalue_01[1];
                  for (lVar11 = 0; lVar11 != 10; lVar11 = lVar11 + 1) {
                    *(double *)(lVar10 + lVar11 * 8) =
                         (1.0 - (double)lVar11 * (double)returnvalue_01[1]) *
                         (double)lVar11 * (double)returnvalue_01[1] * 16.0 * (double)lVar9 * dVar1 *
                         (1.0 - (double)lVar9 * dVar1);
                  }
                  lVar10 = lVar10 + 0x50;
                }
                tres = (sunrealtype)N_VConst(0,local_78);
                heatres(tres,uu,local_78,local_60,returnvalue_01);
                N_VScale(0,local_60,local_78);
                for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
                  for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
                    if ((((lVar10 == 0) || (lVar10 == 9)) || (lVar9 == 9)) || (lVar9 == 0)) {
                      *(undefined8 *)(lVar6 + lVar9 * 8) = 0x3fb999999999999a;
                      *(undefined8 *)(lVar7 + lVar9 * 8) = 0;
                      *(undefined8 *)(lVar8 + lVar9 * 8) = 0;
                    }
                  }
                  lVar8 = lVar8 + 0x50;
                  lVar7 = lVar7 + 0x50;
                  lVar6 = lVar6 + 0x50;
                }
                N_VConst(0,local_80);
                pvVar4 = (void *)IDACreate(ctx);
                local_40 = pvVar4;
                iVar2 = check_retval(pvVar4,"IDACreate",0);
                if (iVar2 == 0) {
                  retval = IDASetUserData(pvVar4,returnvalue_01);
                  iVar3 = 1;
                  iVar2 = check_retval(&retval,"IDASetUserData",1);
                  if (iVar2 == 0) {
                    retval = IDASetId(pvVar4,local_68);
                    iVar3 = 1;
                    iVar2 = check_retval(&retval,"IDASetId",1);
                    if (iVar2 == 0) {
                      retval = IDASetConstraints(pvVar4,local_80);
                      iVar3 = 1;
                      iVar2 = check_retval(&retval,"IDASetConstraints",1);
                      if (iVar2 == 0) {
                        N_VDestroy(local_80);
                        retval = IDAInit(0,pvVar4,heatres,uu,local_78);
                        iVar3 = 1;
                        iVar2 = check_retval(&retval,"IDAInit",1);
                        if (iVar2 == 0) {
                          retval = IDASStolerances(0,0x3f50624dd2f1a9fc,pvVar4);
                          iVar3 = 1;
                          iVar2 = check_retval(&retval,"IDASStolerances",1);
                          if (iVar2 == 0) {
                            pvVar5 = (void *)SUNBandMatrix(100,10,10,ctx);
                            iVar2 = check_retval(pvVar5,"SUNBandMatrix",0);
                            if (iVar2 == 0) {
                              local_58 = (void *)SUNLinSol_Band(uu,pvVar5,ctx);
                              iVar2 = check_retval(local_58,"SUNLinSol_Band",0);
                              if (iVar2 == 0) {
                                retval = IDASetLinearSolver(pvVar4,local_58,pvVar5);
                                iVar3 = 1;
                                iVar2 = check_retval(&retval,"IDASetLinearSolver",1);
                                if (iVar2 == 0) {
                                  iVar3 = 1;
                                  local_80 = (void *)0x3f847ae147ae147b;
                                  retval = IDACalcIC(pvVar4,1);
                                  iVar2 = check_retval(&retval,"IDACalcIC",1);
                                  if (iVar2 == 0) {
                                    puts(
                                        "\nidaHeat2D_bnd: Heat equation, serial example problem for IDA"
                                        );
                                    puts("          Discretized heat equation on 2D unit square.");
                                    printf("          Zero boundary conditions,");
                                    puts(" polynomial initial conditions.");
                                    printf("          Mesh dimensions: %d x %d",10,10);
                                    printf("        Total system size: %d\n\n",100);
                                    printf("Tolerance parameters:  rtol = %g   atol = %g\n",0,
                                           0x3f50624dd2f1a9fc);
                                    puts("Constraints set to force all solution components >= 0. ");
                                    puts("Linear solver: BAND, banded direct solver ");
                                    printf("       difference quotient Jacobian, half-bandwidths = %d \n"
                                           ,10);
                                    printf("IDACalcIC called with input boundary values = %g \n",
                                           0x9999999a);
                                    puts("\n   Output Summary (umax = max-norm of solution) \n");
                                    puts(
                                        "  time       umax     k  nst  nni  nje   nre   nreLS    h      "
                                        );
                                    puts(
                                        " .  .  .  .  .  .  .  .  .  .  .  .  .  .  .  .  .  .  .  .  . "
                                        );
                                    PrintOutput(pvVar4,0.0,uu);
                                    iVar2 = 0xb;
                                    while (bVar12 = iVar2 != 0, iVar2 = iVar2 + -1, bVar12) {
                                      retval = IDASolve((int)local_80,pvVar4,&tret,uu,local_78,1);
                                      iVar3 = check_retval(&retval,"IDASolve",1);
                                      if (iVar3 != 0) {
                                        return 1;
                                      }
                                      PrintOutput(pvVar4,tret,uu);
                                      local_80 = (void *)((double)local_80 + (double)local_80);
                                    }
                                    retval = IDAGetNumErrTestFails(pvVar4,&netf);
                                    check_retval(&retval,"IDAGetNumErrTestFails",1);
                                    retval = IDAGetNumNonlinSolvConvFails(pvVar4,&ncfn);
                                    check_retval(&retval,"IDAGetNumNonlinSolvConvFails",1);
                                    iVar3 = 0;
                                    printf("\n netf = %ld,   ncfn = %ld \n",netf,ncfn);
                                    IDAFree(&local_40);
                                    SUNLinSolFree(local_58);
                                    SUNMatDestroy(pvVar5);
                                    N_VDestroy(uu);
                                    N_VDestroy(local_78);
                                    N_VDestroy(local_68);
                                    N_VDestroy(local_60);
                                    free(returnvalue_01);
                                    SUNContext_Free(&ctx);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
  void* mem;
  UserData data;
  N_Vector uu, up, constraints, id, res;
  int retval, iout;
  long int netf, ncfn;
  sunindextype mu, ml;
  sunrealtype rtol, atol, t0, t1, tout, tret;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  mem  = NULL;
  data = NULL;
  uu = up = constraints = id = res = NULL;
  A                                = NULL;
  LS                               = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Create vectors uu, up, res, constraints, id. */
  uu = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)uu, "N_VNew_Serial", 0)) { return (1); }
  up = N_VClone(uu);
  if (check_retval((void*)up, "N_VNew_Serial", 0)) { return (1); }
  res = N_VClone(uu);
  if (check_retval((void*)res, "N_VNew_Serial", 0)) { return (1); }
  constraints = N_VClone(uu);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }
  id = N_VClone(uu);
  if (check_retval((void*)id, "N_VNew_Serial", 0)) { return (1); }

  /* Create and load problem data block. */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->mm    = MGRID;
  data->dx    = ONE / (MGRID - ONE);
  data->coeff = ONE / ((data->dx) * (data->dx));

  /* Initialize uu, up, id. */
  SetInitialProfile(data, uu, up, id, res);

  /* Set constraints to all 1's for nonnegative solution values. */
  N_VConst(ONE, constraints);

  /* Set remaining input parameters. */
  t0   = ZERO;
  t1   = SUN_RCONST(0.01);
  rtol = ZERO;
  atol = SUN_RCONST(1.0e-3);

  /* Call IDACreate and IDAMalloc to initialize solution */
  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Set which components are algebraic or differential */
  retval = IDASetId(mem, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  retval = IDASetConstraints(mem, constraints);
  if (check_retval(&retval, "IDASetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  retval = IDAInit(mem, heatres, t0, uu, up);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create banded SUNMatrix for use in linear solves */
  mu = MGRID;
  ml = MGRID;
  A  = SUNBandMatrix(NEQ, mu, ml, ctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver object */
  LS = SUNLinSol_Band(uu, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Call IDACalcIC to correct the initial values. */

  retval = IDACalcIC(mem, IDA_YA_YDP_INIT, t1);
  if (check_retval(&retval, "IDACalcIC", 1)) { return (1); }

  /* Print output heading. */
  PrintHeader(rtol, atol);

  PrintOutput(mem, t0, uu);

  /* Loop over output times, call IDASolve, and print results. */

  for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
  {
    retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }

    PrintOutput(mem, tret, uu);
  }

  /* Print remaining counters and free memory. */
  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);
  retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);
  printf("\n netf = %ld,   ncfn = %ld \n", netf, ncfn);

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(uu);
  N_VDestroy(up);
  N_VDestroy(id);
  N_VDestroy(res);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}